

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

bool __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::operator==
          (SpecializationKey *this,SpecializationKey *other)

{
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  bool bVar1;
  pointer ppCVar2;
  pointer ppTVar3;
  pointer ppCVar4;
  pointer ppTVar5;
  bool bVar6;
  
  if ((((this->savedHash == other->savedHash) && (this->definition == other->definition)) &&
      ((this->paramValues).size_ == (other->paramValues).size_)) &&
     ((this->typeParams).size_ == (other->typeParams).size_)) {
    bVar6 = (this->paramValues).size_ == 0;
    if (!bVar6) {
      ppCVar4 = (other->paramValues).data_;
      ppCVar2 = (this->paramValues).data_;
      do {
        lhs = *ppCVar2;
        rhs = *ppCVar4;
        if (rhs == (ConstantValue *)0x0 || lhs == (ConstantValue *)0x0) {
          if (lhs != rhs) goto LAB_003bd3a2;
        }
        else {
          bVar1 = slang::operator==(lhs,rhs);
          if (!bVar1) {
LAB_003bd3a2:
            if (!bVar6) goto LAB_003bd403;
            break;
          }
        }
        ppCVar2 = ppCVar2 + 1;
        ppCVar4 = ppCVar4 + 1;
        bVar6 = ppCVar2 == (this->paramValues).data_ + (this->paramValues).size_;
      } while (!bVar6);
    }
    bVar6 = (this->typeParams).size_ == 0;
    if (!bVar6) {
      ppTVar3 = (other->typeParams).data_;
      ppTVar5 = (this->typeParams).data_;
      do {
        this_00 = *ppTVar5;
        rhs_00 = *ppTVar3;
        if (rhs_00 == (Type *)0x0 || this_00 == (Type *)0x0) {
          if (this_00 != rhs_00) {
            return bVar6;
          }
        }
        else {
          bVar1 = Type::isMatching(this_00,rhs_00);
          if (!bVar1) {
            return bVar6;
          }
        }
        ppTVar5 = ppTVar5 + 1;
        ppTVar3 = ppTVar3 + 1;
        bVar6 = ppTVar5 == (this->typeParams).data_ + (this->typeParams).size_;
      } while (!bVar6);
    }
  }
  else {
LAB_003bd403:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool GenericClassDefSymbol::SpecializationKey::operator==(const SpecializationKey& other) const {
    if (savedHash != other.savedHash || definition != other.definition ||
        paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}